

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

tensor * Oppo(vector<tensor_*,_std::allocator<tensor_*>_> *x)

{
  int iVar1;
  OPPO *this;
  undefined4 extraout_var;
  vector<tensor_*,_std::allocator<tensor_*>_> local_40;
  OPPO *local_18;
  node *op;
  vector<tensor_*,_std::allocator<tensor_*>_> *x_local;
  
  op = (node *)x;
  this = (OPPO *)operator_new(0x48);
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_node)._vptr_node = (_func_int **)0x0;
  (this->super_node).ret = (tensor *)0x0;
  *(undefined8 *)&(this->super_node).isbuild = 0;
  OPPO::OPPO(this);
  local_18 = this;
  std::vector<tensor_*,_std::allocator<tensor_*>_>::vector(&local_40,x);
  iVar1 = (**(this->super_node)._vptr_node)(this,&local_40);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::~vector(&local_40);
  return (tensor *)CONCAT44(extraout_var,iVar1);
}

Assistant:

tensor* Oppo(vector<tensor *> x){
    node *op = new OPPO();
    return op->forward(x);
}